

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

void __thiscall wasm::SExpressionWasmBuilder::parseImport(SExpressionWasmBuilder *this,Element *s)

{
  pointer puVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  SExpressionWasmBuilder *pSVar7;
  _Alloc_hider _Var8;
  _Alloc_hider curr;
  bool bVar9;
  size_t sVar10;
  Element *pEVar11;
  SExpressionWasmBuilder *pSVar12;
  mapped_type *pmVar13;
  SExpressionWasmBuilder *s_00;
  Address AVar14;
  string *psVar15;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *this_00;
  SExpressionWasmBuilder *pSVar16;
  uint uVar17;
  long lVar18;
  ulong startPos;
  int iVar19;
  bool bVar20;
  IString str;
  IString str_00;
  IString str_01;
  IString str_02;
  string_view sVar21;
  string_view sVar22;
  Signature SVar23;
  IString IVar24;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  _Alloc_hider local_c8;
  HeapType tagType;
  IString local_a8;
  string_view local_98;
  size_t local_88;
  SExpressionWasmBuilder *local_80;
  undefined4 local_74;
  SExpressionWasmBuilder *local_70;
  _Alloc_hider local_68;
  __single_object func;
  int local_48;
  
  local_80 = this;
  sVar10 = Element::size(s);
  if ((sVar10 == 4) && (pEVar11 = Element::operator[](s,3), pEVar11->isList_ == true)) {
    pEVar11 = Element::operator[](s,3);
    IVar24.str._M_str = extraout_RDX;
    IVar24.str._M_len = DAT_00e63bd8;
    bVar9 = elementStartsWith(pEVar11,IVar24);
    if (bVar9) {
      bVar9 = true;
      bVar3 = false;
      bVar4 = false;
      bVar5 = false;
      local_48 = 0;
    }
    else {
      pEVar11 = Element::operator[](s,3);
      str.str._M_str = extraout_RDX_00;
      str.str._M_len = MEMORY._8_8_;
      bVar9 = elementStartsWith(pEVar11,str);
      if (bVar9) {
        local_48 = 2;
        bVar4 = true;
        bVar3 = false;
LAB_00a0f04e:
        bVar5 = false;
      }
      else {
        pEVar11 = Element::operator[](s,3);
        str_00.str._M_str = extraout_RDX_01;
        str_00.str._M_len = TABLE._8_8_;
        bVar9 = elementStartsWith(pEVar11,str_00);
        if (!bVar9) {
          pEVar11 = Element::operator[](s,3);
          str_02.str._M_str = extraout_RDX_03;
          str_02.str._M_len = GLOBAL._8_8_;
          bVar9 = elementStartsWith(pEVar11,str_02);
          if (!bVar9) {
            pEVar11 = Element::operator[](s,3);
            bVar9 = false;
            pEVar11 = Element::operator[](pEVar11,0);
            IVar24 = Element::str(pEVar11);
            bVar20 = IVar24.str._M_str == (char *)TAG._8_8_;
            local_48 = (uint)bVar20 * 5 + -1;
            bVar3 = false;
            bVar4 = false;
            bVar5 = false;
            bVar6 = bVar20;
            goto LAB_00a0f09a;
          }
          local_48 = 3;
          bVar3 = true;
          bVar4 = false;
          goto LAB_00a0f04e;
        }
        local_48 = 1;
        bVar5 = true;
        bVar3 = false;
        bVar4 = false;
      }
      bVar9 = false;
    }
    bVar20 = false;
    bVar6 = true;
  }
  else {
    local_48 = -1;
    bVar9 = false;
    bVar3 = false;
    bVar4 = false;
    bVar5 = false;
    bVar20 = false;
    bVar6 = false;
  }
LAB_00a0f09a:
  local_98 = (string_view)ZEXT816(0);
  sVar10 = Element::size(s);
  local_70 = (SExpressionWasmBuilder *)s;
  if ((sVar10 < 4) || (pEVar11 = Element::operator[](s,3), pEVar11->isList_ == true)) {
    if (bVar6) {
      pEVar11 = Element::operator[](s,3);
      sVar10 = Element::size(pEVar11);
      if (1 < sVar10) {
        pEVar11 = Element::operator[](s,3);
        pEVar11 = Element::operator[](pEVar11,1);
        if ((pEVar11->isList_ == false) && ((pEVar11->dollared_ & 1U) != 0)) {
          local_88 = 2;
          s = Element::operator[](s,3);
          lVar18 = 1;
          goto LAB_00a0f21c;
        }
      }
    }
    lVar18 = 1;
    local_88 = 1;
  }
  else {
    lVar18 = 2;
    local_88 = 1;
LAB_00a0f21c:
    pEVar11 = Element::operator[](s,1);
    local_98 = (string_view)Element::str(pEVar11);
    local_74 = (undefined4)CONCAT71(local_98._M_len._1_7_,1);
    if (local_98._M_str != (char *)0x0) goto LAB_00a0f2bc;
  }
  pSVar12 = local_80;
  if (bVar9) {
    iVar19 = local_80->functionCounter;
    local_80->functionCounter = iVar19 + 1;
    std::__cxx11::to_string((string *)&stack0xffffffffffffff38,iVar19);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff98,"fimport$",(string *)&stack0xffffffffffffff38);
    IString::IString(&local_a8,(string *)&stack0xffffffffffffff98);
    local_98._M_str = local_a8.str._M_str;
    local_98._M_len = local_a8.str._M_len;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    this_00 = &pSVar12->functionNames;
LAB_00a0f1a5:
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back(this_00,(value_type *)&local_98)
    ;
  }
  else if (!bVar3) {
    if (bVar4) {
      iVar19 = local_80->memoryCounter;
      local_80->memoryCounter = iVar19 + 1;
      std::__cxx11::to_string((string *)&stack0xffffffffffffff38,iVar19);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff98,"mimport$",(string *)&stack0xffffffffffffff38);
      IString::IString(&local_a8,(string *)&stack0xffffffffffffff98);
    }
    else {
      if (!bVar5) {
        if (!bVar20) {
          psVar15 = (string *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_168,"invalid import",(allocator<char> *)&stack0xffffffffffffff98);
          pEVar11 = Element::operator[]((Element *)local_70,3);
          sVar10 = pEVar11->line;
          pEVar11 = Element::operator[]((Element *)local_70,3);
          sVar2 = pEVar11->col;
          std::__cxx11::string::string(psVar15,local_168);
          *(size_t *)(psVar15 + 0x20) = sVar10;
          *(size_t *)(psVar15 + 0x28) = sVar2;
          __cxa_throw(psVar15,&ParseException::typeinfo,ParseException::~ParseException);
        }
        iVar19 = local_80->tagCounter;
        local_80->tagCounter = iVar19 + 1;
        std::__cxx11::to_string((string *)&stack0xffffffffffffff38,iVar19);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff98,"eimport$",(string *)&stack0xffffffffffffff38);
        IString::IString(&local_a8,(string *)&stack0xffffffffffffff98);
        local_98._M_str = local_a8.str._M_str;
        local_98._M_len = local_a8.str._M_len;
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
        this_00 = &pSVar12->tagNames;
        goto LAB_00a0f1a5;
      }
      iVar19 = local_80->tableCounter;
      local_80->tableCounter = iVar19 + 1;
      std::__cxx11::to_string((string *)&stack0xffffffffffffff38,iVar19);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff98,"timport$",(string *)&stack0xffffffffffffff38);
      IString::IString(&local_a8,(string *)&stack0xffffffffffffff98);
    }
    local_98._M_str = local_a8.str._M_str;
    local_98._M_len = local_a8.str._M_len;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  }
  local_74 = 0;
LAB_00a0f2bc:
  pSVar12 = local_70;
  iVar19 = 0;
  if (bVar6) {
    iVar19 = local_48;
  }
  pEVar11 = Element::operator[]((Element *)local_70,(uint)lVar18);
  sVar21 = (string_view)Element::str(pEVar11);
  uVar17 = (uint)lVar18 + 1;
  pEVar11 = Element::operator[]((Element *)pSVar12,uVar17);
  if (pEVar11->isList_ == true) {
    psVar15 = (string *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              (local_148,"no name for import",(allocator<char> *)&stack0xffffffffffffff98);
    pEVar11 = Element::operator[]((Element *)local_70,uVar17);
    sVar10 = pEVar11->line;
    pEVar11 = Element::operator[]((Element *)local_70,uVar17);
    sVar2 = pEVar11->col;
    std::__cxx11::string::string(psVar15,local_148);
    *(size_t *)(psVar15 + 0x20) = sVar10;
    *(size_t *)(psVar15 + 0x28) = sVar2;
    __cxa_throw(psVar15,&ParseException::typeinfo,ParseException::~ParseException);
  }
  pEVar11 = Element::operator[]((Element *)pSVar12,uVar17);
  sVar22 = (string_view)Element::str(pEVar11);
  if ((sVar21._M_len == 0) || (sVar22._M_len == 0)) {
    psVar15 = (string *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              (local_128,"imports must have module and base",
               (allocator<char> *)&stack0xffffffffffffff98);
    pEVar11 = Element::operator[]((Element *)local_70,uVar17);
    sVar10 = pEVar11->line;
    pEVar11 = Element::operator[]((Element *)local_70,uVar17);
    sVar2 = pEVar11->col;
    std::__cxx11::string::string(psVar15,local_128);
    *(size_t *)(psVar15 + 0x20) = sVar10;
    *(size_t *)(psVar15 + 0x28) = sVar2;
    __cxa_throw(psVar15,&ParseException::typeinfo,ParseException::~ParseException);
  }
  if (bVar6) {
    pSVar12 = (SExpressionWasmBuilder *)Element::operator[]((Element *)local_70,3);
    startPos = local_88;
  }
  else {
    startPos = lVar18 + 2;
    pSVar12 = local_70;
  }
  pSVar7 = local_80;
  uVar17 = (uint)startPos;
  switch(iVar19) {
  case 0:
    std::make_unique<wasm::Function>();
    pSVar7 = local_80;
    local_88 = parseTypeUse(local_80,(Element *)pSVar12,startPos,(HeapType *)(local_68._M_p + 0x38))
    ;
    _Var8._M_p = local_68._M_p;
    *(size_t *)local_68._M_p = local_98._M_len;
    *(char **)(local_68._M_p + 8) = local_98._M_str;
    local_68._M_p[0x10] = SUB41(local_74,0);
    *(string_view *)(local_68._M_p + 0x18) = sVar21;
    *(string_view *)(local_68._M_p + 0x28) = sVar22;
    pmVar13 = std::
              map<wasm::Name,_wasm::HeapType,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::HeapType>_>_>
              ::operator[](&pSVar7->functionTypes,(key_type *)&local_98);
    curr._M_p = local_68._M_p;
    pmVar13->id = ((HeapType *)(_Var8._M_p + 0x38))->id;
    local_68._M_p = (pointer)0x0;
    Module::addFunction(pSVar7->wasm,(Function *)curr._M_p);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &stack0xffffffffffffff98);
    startPos = local_88;
    break;
  case 1:
    std::make_unique<wasm::Table>();
    pSVar7 = local_80;
    *(size_t *)local_68._M_p = local_98._M_len;
    *(char **)(local_68._M_p + 8) = local_98._M_str;
    local_68._M_p[0x10] = SUB41(local_74,0);
    *(string_view *)(local_68._M_p + 0x18) = sVar21;
    *(string_view *)(local_68._M_p + 0x28) = sVar22;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&local_80->tableNames,(value_type *)&local_98);
    sVar10 = Element::size((Element *)pSVar12);
    if (startPos < sVar10 - 1) {
      pEVar11 = Element::operator[]((Element *)pSVar12,uVar17);
      AVar14 = getAddress(pEVar11);
      ((HeapType *)(local_68._M_p + 0x38))->id = AVar14.addr;
      checkAddress(AVar14,"excessive table init size",pEVar11);
      startPos = (ulong)(uVar17 + 1);
    }
    sVar10 = Element::size((Element *)pSVar12);
    uVar17 = (uint)startPos;
    if ((startPos & 0xffffffff) < sVar10 - 1) {
      pEVar11 = Element::operator[]((Element *)pSVar12,uVar17);
      AVar14 = getAddress(pEVar11);
      *(address64_t *)(local_68._M_p + 0x40) = AVar14.addr;
      checkAddress(AVar14,"excessive table max size",pEVar11);
      uVar17 = uVar17 + 1;
    }
    else {
      *(size_t *)(local_68._M_p + 0x40) = 0xffffffff;
    }
    Module::addTable(pSVar7->wasm,
                     (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                     &stack0xffffffffffffff98);
    std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
              ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
               &stack0xffffffffffffff98);
    startPos = (ulong)(uVar17 + 1);
    break;
  case 2:
    std::make_unique<wasm::Memory>();
    pSVar7 = local_80;
    *(size_t *)local_68._M_p = local_98._M_len;
    *(char **)(local_68._M_p + 8) = local_98._M_str;
    local_68._M_p[0x10] = SUB41(local_74,0);
    *(string_view *)(local_68._M_p + 0x18) = sVar21;
    *(string_view *)(local_68._M_p + 0x28) = sVar22;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&local_80->memoryNames,(value_type *)&local_98);
    pSVar16 = pSVar12;
    pEVar11 = Element::operator[]((Element *)pSVar12,uVar17);
    if (pEVar11->isList_ == true) {
      s_00 = (SExpressionWasmBuilder *)Element::operator[]((Element *)pSVar12,uVar17);
      str_01.str._M_str = extraout_RDX_02;
      str_01.str._M_len = SHARED._8_8_;
      pSVar16 = s_00;
      bVar9 = elementStartsWith((Element *)s_00,str_01);
      if (!bVar9) {
        psVar15 = (string *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_108,"bad memory limit declaration",
                   (allocator<char> *)&stack0xffffffffffffff38);
        pEVar11 = Element::operator[]((Element *)pSVar12,uVar17);
        sVar10 = pEVar11->line;
        pEVar11 = Element::operator[]((Element *)pSVar12,uVar17);
        sVar2 = pEVar11->col;
        std::__cxx11::string::string(psVar15,local_108);
        *(size_t *)(psVar15 + 0x20) = sVar10;
        *(size_t *)(psVar15 + 0x28) = sVar2;
        __cxa_throw(psVar15,&ParseException::typeinfo,ParseException::~ParseException);
      }
      *(undefined1 *)
       &(((vector<wasm::Type,_std::allocator<wasm::Type>_> *)(local_68._M_p + 0x48))->
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.super__Vector_impl_data
        ._M_start = 1;
      uVar17 = parseMemoryLimits(pSVar16,(Element *)s_00,1,
                                 (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                 &stack0xffffffffffffff98);
    }
    else {
      uVar17 = parseMemoryLimits(pSVar16,(Element *)pSVar12,uVar17,
                                 (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                 &stack0xffffffffffffff98);
    }
    Module::addMemory(pSVar7->wasm,
                      (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                      &stack0xffffffffffffff98);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
               &stack0xffffffffffffff98);
    startPos = (ulong)uVar17;
    break;
  case 3:
    parseGlobal(local_80,(Element *)pSVar12,true);
    puVar1 = (pSVar7->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(string_view *)
     ((long)&(puVar1[-1]._M_t.
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable + 0x18) =
         sVar21;
    *(string_view *)
     ((long)&(puVar1[-1]._M_t.
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable + 0x28) =
         sVar22;
    startPos = (ulong)(uVar17 + 1);
    break;
  case 4:
    std::make_unique<wasm::Tag>();
    pSVar7 = local_80;
    local_c8._M_p = (pointer)0x1;
    startPos = parseTypeUse(local_80,(Element *)pSVar12,startPos,
                            (HeapType *)&stack0xffffffffffffff38);
    SVar23 = HeapType::getSignature((HeapType *)&stack0xffffffffffffff38);
    _Var8._M_p = local_68._M_p;
    *(Signature *)(local_68._M_p + 0x38) = SVar23;
    *(size_t *)local_68._M_p = local_98._M_len;
    *(char **)(local_68._M_p + 8) = local_98._M_str;
    local_68._M_p[0x10] = SUB41(local_74,0);
    *(string_view *)(local_68._M_p + 0x18) = sVar21;
    *(string_view *)(local_68._M_p + 0x28) = sVar22;
    local_68._M_p = (pointer)0x0;
    Module::addTag(pSVar7->wasm,(Tag *)_Var8._M_p);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
              ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&stack0xffffffffffffff98);
  }
  sVar10 = Element::size((Element *)pSVar12);
  if ((startPos & 0xffffffff) < sVar10) {
    psVar15 = (string *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              (local_e8,"invalid element",(allocator<char> *)&stack0xffffffffffffff98);
    pEVar11 = Element::operator[]((Element *)pSVar12,(uint)startPos);
    sVar10 = pEVar11->line;
    pEVar11 = Element::operator[]((Element *)pSVar12,(uint)startPos);
    sVar2 = pEVar11->col;
    std::__cxx11::string::string(psVar15,local_e8);
    *(size_t *)(psVar15 + 0x20) = sVar10;
    *(size_t *)(psVar15 + 0x28) = sVar2;
    __cxa_throw(psVar15,&ParseException::typeinfo,ParseException::~ParseException);
  }
  return;
}

Assistant:

void SExpressionWasmBuilder::parseImport(Element& s) {
  size_t i = 1;
  // (import "env" "STACKTOP" (global $stackTop i32))
  bool newStyle = s.size() == 4 && s[3]->isList();
  auto kind = ExternalKind::Invalid;
  if (newStyle) {
    if (elementStartsWith(*s[3], FUNC)) {
      kind = ExternalKind::Function;
    } else if (elementStartsWith(*s[3], MEMORY)) {
      kind = ExternalKind::Memory;
    } else if (elementStartsWith(*s[3], TABLE)) {
      kind = ExternalKind::Table;
    } else if (elementStartsWith(*s[3], GLOBAL)) {
      kind = ExternalKind::Global;
    } else if ((*s[3])[0]->str() == TAG) {
      kind = ExternalKind::Tag;
    } else {
      newStyle = false; // either (param..) or (result..)
    }
  }
  Index newStyleInner = 1;
  Name name;
  if (s.size() > 3 && s[3]->isStr()) {
    name = s[i++]->str();
  } else if (newStyle && newStyleInner < s[3]->size() &&
             (*s[3])[newStyleInner]->dollared()) {
    name = (*s[3])[newStyleInner++]->str();
  }
  bool hasExplicitName = name.is();
  if (!hasExplicitName) {
    if (kind == ExternalKind::Function) {
      name = Name("fimport$" + std::to_string(functionCounter++));
      functionNames.push_back(name);
    } else if (kind == ExternalKind::Global) {
      // Handled in `parseGlobal`.
    } else if (kind == ExternalKind::Memory) {
      name = Name("mimport$" + std::to_string(memoryCounter++));
    } else if (kind == ExternalKind::Table) {
      name = Name("timport$" + std::to_string(tableCounter++));
    } else if (kind == ExternalKind::Tag) {
      name = Name("eimport$" + std::to_string(tagCounter++));
      tagNames.push_back(name);
    } else {
      throw ParseException("invalid import", s[3]->line, s[3]->col);
    }
  }
  if (!newStyle) {
    kind = ExternalKind::Function;
  }
  auto module = s[i++]->str();
  if (!s[i]->isStr()) {
    throw ParseException("no name for import", s[i]->line, s[i]->col);
  }
  auto base = s[i]->str();
  if (!module.size() || !base.size()) {
    throw ParseException(
      "imports must have module and base", s[i]->line, s[i]->col);
  }
  i++;
  // parse internals
  Element& inner = newStyle ? *s[3] : s;
  Index j = newStyle ? newStyleInner : i;
  if (kind == ExternalKind::Function) {
    auto func = std::make_unique<Function>();

    j = parseTypeUse(inner, j, func->type);
    func->setName(name, hasExplicitName);
    func->module = module;
    func->base = base;
    functionTypes[name] = func->type;
    wasm.addFunction(func.release());
  } else if (kind == ExternalKind::Global) {
    parseGlobal(inner, true);
    j++;
    auto& global = wasm.globals.back();
    global->module = module;
    global->base = base;
  } else if (kind == ExternalKind::Table) {
    auto table = std::make_unique<Table>();
    table->setName(name, hasExplicitName);
    table->module = module;
    table->base = base;
    tableNames.push_back(name);

    if (j < inner.size() - 1) {
      auto initElem = inner[j++];
      table->initial = getAddress(initElem);
      checkAddress(table->initial, "excessive table init size", initElem);
    }
    if (j < inner.size() - 1) {
      auto maxElem = inner[j++];
      table->max = getAddress(maxElem);
      checkAddress(table->max, "excessive table max size", maxElem);
    } else {
      table->max = Table::kUnlimitedSize;
    }

    wasm.addTable(std::move(table));

    j++; // funcref
    // ends with the table element type
  } else if (kind == ExternalKind::Memory) {
    auto memory = std::make_unique<Memory>();
    memory->setName(name, hasExplicitName);
    memory->module = module;
    memory->base = base;
    memoryNames.push_back(name);

    if (inner[j]->isList()) {
      auto& limits = *inner[j];
      if (!elementStartsWith(limits, SHARED)) {
        throw ParseException(
          "bad memory limit declaration", inner[j]->line, inner[j]->col);
      }
      memory->shared = true;
      j = parseMemoryLimits(limits, 1, memory);
    } else {
      j = parseMemoryLimits(inner, j, memory);
    }

    wasm.addMemory(std::move(memory));
  } else if (kind == ExternalKind::Tag) {
    auto tag = std::make_unique<Tag>();
    HeapType tagType;
    j = parseTypeUse(inner, j, tagType);
    tag->sig = tagType.getSignature();
    tag->setName(name, hasExplicitName);
    tag->module = module;
    tag->base = base;
    wasm.addTag(tag.release());
  }
  // If there are more elements, they are invalid
  if (j < inner.size()) {
    throw ParseException("invalid element", inner[j]->line, inner[j]->col);
  }
}